

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O2

void __thiscall QPDFJob::doJSONPageLabels(QPDFJob *this,Pipeline *p,bool *first,QPDF *pdf)

{
  bool bVar1;
  longlong lVar2;
  pointer pQVar3;
  allocator<char> local_e9;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> labels;
  string local_d0;
  QPDFObjectHandle local_b0;
  JSON j_labels;
  JSON j_label;
  QPDFPageLabelDocumentHelper pldh;
  JSON local_50;
  JSON local_40;
  
  JSON::makeArray();
  QPDFPageLabelDocumentHelper::QPDFPageLabelDocumentHelper(&pldh,pdf);
  QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&local_d0,pdf);
  QPDFPageDocumentHelper::getAllPages
            ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&labels,
             (QPDFPageDocumentHelper *)&local_d0);
  j_label.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (((long)labels.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
               _M_impl.super__Vector_impl_data._M_finish -
        (long)labels.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl
              .super__Vector_impl_data._M_start) / 0x38);
  lVar2 = QIntC::IntConverter<unsigned_long,_long_long,_false,_true>::convert
                    ((unsigned_long *)&j_label);
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
            ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&labels);
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&local_d0);
  bVar1 = QPDFPageLabelDocumentHelper::hasPageLabels(&pldh);
  if (bVar1) {
    labels.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    labels.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    labels.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    QPDFPageLabelDocumentHelper::getLabelsForPageRange(&pldh,0,lVar2 + -1,0,&labels);
    for (pQVar3 = labels.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        (pQVar3 != labels.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                   _M_impl.super__Vector_impl_data._M_finish &&
        (pQVar3 + 1 !=
         labels.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
         super__Vector_impl_data._M_finish)); pQVar3 = pQVar3 + 2) {
      JSON::makeDictionary();
      JSON::addArrayElement(&j_label,&j_labels);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_d0._M_string_length);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"index",&local_e9);
      QPDFObjectHandle::getJSON
                (&local_b0,(int)pQVar3,
                 SUB41(((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->json_version,0));
      JSON::addDictionaryMember(&local_40,(string *)&j_label,(JSON *)&local_d0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_40.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_b0.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"label",&local_e9);
      QPDFObjectHandle::getJSON
                (&local_b0,(int)pQVar3 + 0x10,
                 SUB41(((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->json_version,0));
      JSON::addDictionaryMember(&local_50,(string *)&j_label,(JSON *)&local_d0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_50.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_b0.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&j_label.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&labels);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"pagelabels",(allocator<char> *)&labels);
  JSON::writeDictionaryItem(p,first,&local_d0,&j_labels,1);
  std::__cxx11::string::~string((string *)&local_d0);
  QPDFPageLabelDocumentHelper::~QPDFPageLabelDocumentHelper(&pldh);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&j_labels.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void
QPDFJob::doJSONPageLabels(Pipeline* p, bool& first, QPDF& pdf)
{
    JSON j_labels = JSON::makeArray();
    QPDFPageLabelDocumentHelper pldh(pdf);
    long long npages = QIntC::to_longlong(QPDFPageDocumentHelper(pdf).getAllPages().size());
    if (pldh.hasPageLabels()) {
        std::vector<QPDFObjectHandle> labels;
        pldh.getLabelsForPageRange(0, npages - 1, 0, labels);
        for (auto iter = labels.begin(); iter != labels.end(); ++iter) {
            if ((iter + 1) == labels.end()) {
                // This can't happen, so ignore it. This could only happen if getLabelsForPageRange
                // somehow returned an odd number of items.
                break;
            }
            JSON j_label = j_labels.addArrayElement(JSON::makeDictionary());
            j_label.addDictionaryMember("index", (*iter).getJSON(m->json_version));
            ++iter;
            j_label.addDictionaryMember("label", (*iter).getJSON(m->json_version));
        }
    }
    JSON::writeDictionaryItem(p, first, "pagelabels", j_labels, 1);
}